

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

void __thiscall
google::protobuf::EncodedDescriptorDatabase::EncodedDescriptorDatabase
          (EncodedDescriptorDatabase *this)

{
  _Base_ptr p_Var1;
  DescriptorIndex *__s;
  
  (this->super_DescriptorDatabase)._vptr_DescriptorDatabase =
       (_func_int **)&PTR__EncodedDescriptorDatabase_004e34d8;
  __s = (DescriptorIndex *)operator_new(0xf0);
  memset(__s,0,0xf0);
  (__s->by_name_)._M_t._M_impl.
  super__Rb_tree_key_compare<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare>
       = (_Rb_tree_key_compare<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare>
          )__s;
  p_Var1 = (_Base_ptr)((long)&(__s->by_name_)._M_t._M_impl + 8);
  (((_Rb_tree_header *)((long)&(__s->by_name_)._M_t._M_impl + 8))->_M_header)._M_color = _S_red;
  *(_Base_ptr *)((long)&(__s->by_name_)._M_t._M_impl + 0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)((long)&(__s->by_name_)._M_t._M_impl + 0x18) = p_Var1;
  *(_Base_ptr *)((long)&(__s->by_name_)._M_t._M_impl + 0x20) = p_Var1;
  *(size_t *)((long)&(__s->by_name_)._M_t._M_impl + 0x28) = 0;
  (__s->by_name_flat_).
  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = 0;
  *(pointer *)
   ((long)&(__s->by_name_flat_).
           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
           ._M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(__s->by_name_flat_).
           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
           ._M_impl + 0x10) = (pointer)0x0;
  (__s->by_symbol_)._M_t._M_impl.
  super__Rb_tree_key_compare<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>
       = (_Rb_tree_key_compare<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>
          )__s;
  p_Var1 = (_Base_ptr)((long)&(__s->by_symbol_)._M_t._M_impl + 8);
  (((_Rb_tree_header *)((long)&(__s->by_symbol_)._M_t._M_impl + 8))->_M_header)._M_color = _S_red;
  *(_Base_ptr *)((long)&(__s->by_symbol_)._M_t._M_impl + 0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)((long)&(__s->by_symbol_)._M_t._M_impl + 0x18) = p_Var1;
  *(_Base_ptr *)((long)&(__s->by_symbol_)._M_t._M_impl + 0x20) = p_Var1;
  *(size_t *)((long)&(__s->by_symbol_)._M_t._M_impl + 0x28) = 0;
  (__s->by_symbol_flat_).
  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = 0;
  *(pointer *)
   ((long)&(__s->by_symbol_flat_).
           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
           ._M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(__s->by_symbol_flat_).
           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
           ._M_impl + 0x10) = (pointer)0x0;
  (__s->by_extension_)._M_t._M_impl.
  super__Rb_tree_key_compare<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare>
       = (_Rb_tree_key_compare<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare>
          )__s;
  p_Var1 = (_Base_ptr)((long)&(__s->by_extension_)._M_t._M_impl + 8);
  (((_Rb_tree_header *)((long)&(__s->by_extension_)._M_t._M_impl + 8))->_M_header)._M_color = _S_red
  ;
  *(_Base_ptr *)((long)&(__s->by_extension_)._M_t._M_impl + 0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)((long)&(__s->by_extension_)._M_t._M_impl + 0x18) = p_Var1;
  *(_Base_ptr *)((long)&(__s->by_extension_)._M_t._M_impl + 0x20) = p_Var1;
  *(pointer *)
   ((long)&(__s->by_extension_flat_).
           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
           ._M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(__s->by_extension_flat_).
           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
           ._M_impl + 0x10) = (pointer)0x0;
  *(size_t *)((long)&(__s->by_extension_)._M_t._M_impl + 0x28) = 0;
  (__s->by_extension_flat_).
  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = 0;
  (this->index_)._M_t.
  super___uniq_ptr_impl<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex,_std::default_delete<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex_*,_std::default_delete<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>_>
  .super__Head_base<0UL,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex_*,_false>.
  _M_head_impl = __s;
  (this->files_to_delete_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->files_to_delete_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->files_to_delete_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

EncodedDescriptorDatabase::EncodedDescriptorDatabase()
    : index_(new DescriptorIndex()) {}